

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O2

char * OPENSSL_strndup(char *str,size_t size)

{
  size_t __n;
  char *__dest;
  
  __n = OPENSSL_strnlen(str,size);
  if (__n == 0xffffffffffffffff) {
    __dest = (char *)0x0;
    ERR_put_error(0xe,0,0x41,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mem.cc"
                  ,0x20b);
  }
  else {
    __dest = (char *)OPENSSL_malloc(__n + 1);
    if (__dest == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      if (__n != 0) {
        memcpy(__dest,str,__n);
      }
      __dest[__n] = '\0';
    }
  }
  return __dest;
}

Assistant:

char *OPENSSL_strndup(const char *str, size_t size) {
  size = OPENSSL_strnlen(str, size);

  size_t alloc_size = size + 1;
  if (alloc_size < size) {
    // overflow
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_MALLOC_FAILURE);
    return NULL;
  }
  char *ret = reinterpret_cast<char *>(OPENSSL_malloc(alloc_size));
  if (ret == NULL) {
    return NULL;
  }

  OPENSSL_memcpy(ret, str, size);
  ret[size] = '\0';
  return ret;
}